

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

void __thiscall sc_core::sc_trace_file_base::delta_cycles(sc_trace_file_base *this,bool flag)

{
  byte in_SIL;
  long in_RDI;
  phase_cb_mask mask;
  undefined7 in_stack_fffffffffffffff0;
  
  *(byte *)(in_RDI + 0xb9) = in_SIL & 1;
  mask = (phase_cb_mask)((ulong)in_RDI >> 0x20);
  if ((*(byte *)(in_RDI + 0xb9) & 1) == 0) {
    sc_object::unregister_simulation_phase_callback
              ((sc_object *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),mask);
  }
  else {
    sc_object::register_simulation_phase_callback
              ((sc_object *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),mask);
  }
  return;
}

Assistant:

void
sc_trace_file_base::delta_cycles( bool flag )
{
    trace_delta_cycles_ = flag;
#if SC_TRACING_PHASE_CALLBACKS_
    if( trace_delta_cycles_ ) {
        sc_object::register_simulation_phase_callback( SC_END_OF_UPDATE );
    } else {
        sc_object::unregister_simulation_phase_callback( SC_END_OF_UPDATE );
    }
#endif
}